

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_apbe.c
# Opt level: O0

void gga_k_apbe_init(xc_func_type *p)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  gga_k_apbeint_params *params;
  
  pvVar2 = malloc(0x20);
  in_RDI[0x2f] = pvVar2;
  puVar1 = (undefined8 *)in_RDI[0x2f];
  if (*(int *)*in_RDI == 0x35) {
    *puVar1 = 0x3ff3eb851eb851ec;
    puVar1[1] = 0x3ffaaaaaaaaaaaab;
    puVar1[2] = 0x3fce97396d0917d7;
    puVar1[3] = 0x3fc7b425ed097b42;
  }
  else {
    if (*(int *)*in_RDI != 0x36) {
      fprintf(_stderr,"Internal error in gga_k_apbeint\n");
      exit(1);
    }
    *puVar1 = 0x3fe9ba5e353f7cee;
    puVar1[1] = 0x3ffaaaaaaaaaaaab;
    puVar1[2] = 0x3fce97396d0917d7;
    puVar1[3] = 0x3fc7b425ed097b42;
  }
  return;
}

Assistant:

static void
gga_k_apbe_init(xc_func_type *p)
{
  gga_k_apbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_apbe_params));
  params = (gga_k_apbe_params *) (p->params);

  params->lambda = 0.0;

  switch(p->info->number){
  case XC_GGA_K_APBE:
    params->kappa = 0.8040;
    params->mu    = 0.23889;
    break;
  case XC_GGA_K_TW1:
    params->kappa = 0.8209;
    params->mu    = 0.2335;
    break;
  case XC_GGA_K_TW2:
    params->kappa = 0.6774;
    params->mu    = 0.2371;
    break;
  case XC_GGA_K_TW3:
    params->kappa = 0.8438;
    params->mu    = 0.2319;
    break;
  case XC_GGA_K_TW4:
    params->kappa = 0.8589;
    params->mu    = 0.2309;
    break;
  case XC_GGA_K_REVAPBE:
    params->kappa = 1.245;
    params->mu    = 0.23889;
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_apbe\n");
    exit(1);
  }
}